

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nucleon.cxx
# Opt level: O3

double __thiscall
trento::MonteCarloCrossSection::operator()(MonteCarloCrossSection *this,double sigma_partonic)

{
  double dVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  out_of_range *this_00;
  double *pdVar8;
  double *pdVar9;
  allocator_type *__a;
  allocator_type *__a_00;
  const_iterator cVar10;
  iterator __end2_1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last_00;
  iterator __end2;
  int iVar11;
  double *pdVar12;
  undefined1 auVar13 [16];
  double dVar14;
  undefined8 in_XMM0_Qb;
  undefined1 auVar15 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_XMM5 [16];
  CyclicNormal<double> cyclic_normal;
  vector<Constituent,_std::allocator<Constituent>_> nucleonB;
  vector<Constituent,_std::allocator<Constituent>_> nucleonA;
  CyclicNormal<double> local_f8;
  double local_c8;
  undefined8 uStack_c0;
  double local_b8;
  int local_ac;
  double *local_a8;
  ulong local_a0;
  double local_98;
  double local_90;
  double local_88;
  undefined8 uStack_80;
  double *local_78;
  double *local_70;
  double *local_60;
  double *local_58;
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  
  local_c8 = sigma_partonic;
  uStack_c0 = in_XMM0_Qb;
  random::CyclicNormal<double>::CyclicNormal
            (&local_f8,0.0,this->sampling_width_,this->cache_size,this->n_loops);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(&local_60,this->constituent_number_,__a);
  std::
  vector<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent,std::allocator<trento::MonteCarloCrossSection::TEMPNAMEPLACEHOLDERVALUE(double)const::Constituent>>
  ::operator()(&local_78,this->constituent_number_,__a_00);
  if (this->n_max != 0) {
    auVar5._8_8_ = uStack_c0;
    auVar5._0_8_ = local_c8;
    iVar11 = 0;
    local_a0 = 0;
    auVar13._8_8_ = 0x8000000000000000;
    auVar13._0_8_ = 0x8000000000000000;
    local_48 = vxorpd_avx512vl(auVar5,auVar13);
    local_a8 = local_60;
    local_90 = this->max_impact_ * this->max_impact_ * 3.141592653589793;
    local_88 = 0.0;
    local_98 = 0.0;
    do {
      pdVar12 = local_a8;
      uStack_80 = 0;
      local_c8 = this->max_impact_;
      auVar15._0_8_ =
           std::
           generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                     ((mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                       *)&random::engine);
      auVar15._8_56_ = extraout_var;
      local_ac = iVar11;
      pdVar9 = pdVar12;
      if (auVar15._0_8_ < 0.0) {
        local_b8 = sqrt(auVar15._0_8_);
        __last._M_current =
             local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar6 = local_f8.loop_count;
      }
      else {
        auVar13 = vsqrtsd_avx(auVar15._0_16_,auVar15._0_16_);
        local_b8 = auVar13._0_8_;
        __last._M_current =
             local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        uVar6 = local_f8.loop_count;
      }
      for (; __last_00._M_current =
                  local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish, uVar7 = local_f8.loop_count, pdVar8 = local_78,
          pdVar9 != local_58; pdVar9 = pdVar9 + 2) {
        if (local_f8.n_loops_ < uVar6) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,__last,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_f8.loop_count = 0;
          uVar6 = 0;
          __last._M_current =
               local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        cVar10._M_current = local_f8.iter_._M_current;
        if (local_f8.iter_._M_current == __last._M_current) {
          uVar6 = uVar6 + 1;
          cVar10._M_current =
               local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_f8.loop_count = uVar6;
        }
        local_f8.iter_._M_current = cVar10._M_current + 1;
        *pdVar9 = *cVar10._M_current;
        if (local_f8.n_loops_ < uVar6) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,__last,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_f8.loop_count = 0;
          uVar6 = 0;
          __last._M_current =
               local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        pdVar8 = local_f8.iter_._M_current;
        if (local_f8.iter_._M_current == __last._M_current) {
          uVar6 = uVar6 + 1;
          pdVar8 = local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f8.loop_count = uVar6;
        }
        local_f8.iter_._M_current = pdVar8 + 1;
        pdVar9[1] = *pdVar8;
      }
      for (; pdVar8 != local_70; pdVar8 = pdVar8 + 2) {
        if (local_f8.n_loops_ < uVar7) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,__last_00,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_f8.loop_count = 0;
          uVar7 = 0;
          __last_00._M_current =
               local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        cVar10._M_current = local_f8.iter_._M_current;
        if (local_f8.iter_._M_current == __last_00._M_current) {
          uVar7 = uVar7 + 1;
          cVar10._M_current =
               local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
          local_f8.loop_count = uVar7;
        }
        local_f8.iter_._M_current = cVar10._M_current + 1;
        *pdVar8 = *cVar10._M_current;
        if (local_f8.n_loops_ < uVar7) {
          std::
          shuffle<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
                    ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
                     local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start,__last_00,
                     (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                      *)&random::engine);
          local_f8.loop_count = 0;
          uVar7 = 0;
          __last_00._M_current =
               local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
        pdVar9 = local_f8.iter_._M_current;
        if (local_f8.iter_._M_current == __last_00._M_current) {
          uVar7 = uVar7 + 1;
          pdVar9 = local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f8.loop_count = uVar7;
        }
        local_f8.iter_._M_current = pdVar9 + 1;
        pdVar8[1] = *pdVar9;
      }
      if (pdVar12 == local_58) {
        dVar14 = 0.0;
      }
      else {
        dVar14 = 0.0;
        dVar1 = local_b8 * local_c8;
        local_b8 = dVar1;
        pdVar9 = local_78;
        do {
          for (; pdVar9 != local_70; pdVar9 = pdVar9 + 2) {
            dVar1 = dVar1 + (*pdVar12 - *pdVar9);
            local_c8 = dVar14;
            dVar14 = exp(((dVar1 * dVar1 + (pdVar12[1] - pdVar9[1]) * (pdVar12[1] - pdVar9[1])) *
                         -0.25) / this->constituent_width_sq_);
            dVar14 = local_c8 + dVar14;
            dVar1 = local_b8;
          }
          pdVar12 = pdVar12 + 2;
          pdVar9 = local_78;
        } while (pdVar12 != local_58);
      }
      auVar13 = vcvtusi2sd_avx512f(in_XMM5,this->constituent_number_);
      dVar14 = exp(dVar14 * (((double)local_48._0_8_ * this->prefactor_) /
                            (auVar13._0_8_ + auVar13._0_8_)));
      pdVar9 = local_a8;
      auVar13 = vcvtusi2sd_avx512f(in_XMM5,local_a0);
      iVar11 = local_ac + 1;
      dVar14 = local_98 + dVar14;
      dVar1 = (1.0 - dVar14 / auVar13._0_8_) * local_90;
      auVar4._8_8_ = 0x7fffffffffffffff;
      auVar4._0_8_ = 0x7fffffffffffffff;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar1 - local_88;
      auVar13 = vandpd_avx512vl(auVar16,auVar4);
      auVar17._8_8_ = 0;
      auVar17._0_8_ = this->tolerance;
      if (this->tolerance <= auVar13._0_8_) {
        iVar11 = 0;
      }
      if (this->n_pass < iVar11) {
        uStack_c0 = 0;
        local_c8 = dVar1;
        if (local_78 != (double *)0x0) {
          operator_delete(local_78);
        }
        if (pdVar9 != (double *)0x0) {
          operator_delete(pdVar9);
        }
        if (local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (double *)0x0) {
          operator_delete(local_f8.cache_.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        return local_c8;
      }
      uVar2 = vcmpsd_avx512f(auVar13,auVar17,1);
      bVar3 = (bool)((byte)uVar2 & 1);
      local_a0 = local_a0 + 1;
      local_88 = (double)((ulong)bVar3 * (long)local_88 + (ulong)!bVar3 * (long)dVar1);
      uStack_80 = 0;
      local_98 = dVar14;
    } while (local_a0 < this->n_max);
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range
            (this_00,
             "Partonic cross section failed to converge       -- check nucleon width, constituent width, and constituent number"
            );
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

double MonteCarloCrossSection::operator() (const double sigma_partonic) const {

  random::CyclicNormal<> cyclic_normal{
    0., sampling_width_, cache_size, n_loops
  };

  struct Constituent {
    double x, y;
  };

  std::vector<Constituent> nucleonA(constituent_number_);
  std::vector<Constituent> nucleonB(constituent_number_);

  auto max_impact_sq_ = sqr(max_impact_);
  double ref_cross_section = 0.;
  double prob_miss = 0.;
  int pass_tolerance = 0;

  for (std::size_t n = 0; n < n_max; ++n) {
    // Sample b from P(b)db = 2*pi*b.
    auto b = max_impact_ * std::sqrt(random::canonical<double>());

    for (auto&& q : nucleonA) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    for (auto&& q : nucleonB) {
      q.x = cyclic_normal(random::engine);
      q.y = cyclic_normal(random::engine);
    }

    auto overlap = 0.;
    for (auto&& qA : nucleonA) {
      for (auto&& qB : nucleonB) {
        auto distance_sq = sqr(qA.x - qB.x + b) + sqr(qA.y - qB.y);
        overlap += std::exp(-.25*distance_sq/constituent_width_sq_);
      }
    }

    prob_miss +=
      std::exp(-sigma_partonic * prefactor_/(2.*constituent_number_) * overlap);

    auto prob_hit = 1. - (prob_miss/n);
    auto cross_section = M_PI*max_impact_sq_*prob_hit;

    auto update_difference = std::abs(cross_section - ref_cross_section);

    if (update_difference < tolerance) {
      ++pass_tolerance;
    } else {
      pass_tolerance = 0;
      ref_cross_section = cross_section;
    }

    if (pass_tolerance > n_pass){
      return cross_section;
    }
  }

  throw std::out_of_range{
    "Partonic cross section failed to converge \
      -- check nucleon width, constituent width, and constituent number"};
}